

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O2

int run_test_tcp_create_early(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_130;
  int namelen;
  uv_os_fd_t fd;
  sockaddr_in sockname;
  sockaddr_in addr;
  uv_tcp_t client;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init_ex(uVar2,&client,2);
    if (iVar1 == 0) {
      iVar1 = uv_fileno(&client,&fd);
      if (iVar1 == 0) {
        if (fd == -1) {
          pcVar3 = "fd != INVALID_FD";
          uStack_130 = 0x6c;
        }
        else {
          iVar1 = uv_tcp_getsockname(&client,&sockname);
          if (iVar1 == 0) {
            if (sockname.sin_family == 2) {
              iVar1 = uv_tcp_bind(&client,&addr,0);
              if (iVar1 == 0) {
                iVar1 = uv_tcp_getsockname(&client,&sockname);
                if (iVar1 == 0) {
                  if (addr.sin_addr.s_addr == sockname.sin_addr.s_addr) {
                    uv_close(&client,0);
                    uVar2 = uv_default_loop();
                    uv_run(uVar2,0);
                    loop = (uv_loop_t *)uv_default_loop();
                    close_loop(loop);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar2);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                    uStack_130 = 0x83;
                  }
                  else {
                    pcVar3 = 
                    "memcmp(&addr.sin_addr, &sockname.sin_addr, sizeof(addr.sin_addr)) == 0";
                    uStack_130 = 0x7e;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uStack_130 = 0x7b;
                }
              }
              else {
                pcVar3 = "r == 0";
                uStack_130 = 0x77;
              }
            }
            else {
              pcVar3 = "sockname.sin_family == AF_INET";
              uStack_130 = 0x73;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_130 = 0x72;
          }
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_130 = 0x6b;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_130 = 0x68;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_130 = 0x65;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
          ,uStack_130,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_create_early) {
  struct sockaddr_in addr;
  struct sockaddr_in sockname;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r, namelen;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(sockname.sin_family == AF_INET);
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
  ASSERT(r == 0);
  ASSERT(memcmp(&addr.sin_addr,
                &sockname.sin_addr,
                sizeof(addr.sin_addr)) == 0);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}